

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O0

bool __thiscall higan::HttpRequest::SetVersion(HttpRequest *this,char *begin,char *end)

{
  bool bVar1;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string version;
  char *end_local;
  char *begin_local;
  HttpRequest *this_local;
  
  version.field_2._8_8_ = end;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)local_48,begin,end,&local_49);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"HTTP/1.0");
  if (bVar1) {
    this->version_ = HTTP_VERSION_10;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"HTTP/1.1");
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_0015aaaa;
    }
    this->version_ = HTTP_VERSION_11;
  }
  this_local._7_1_ = true;
LAB_0015aaaa:
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool HttpRequest::SetVersion(const char* begin, const char* end)
{
	std::string version(begin, end);

	if (version == "HTTP/1.0")
	{
		version_ = HTTP_VERSION_10;
	}
	else if (version == "HTTP/1.1")
	{
		version_ = HTTP_VERSION_11;
	}
	else
	{
		return false;
	}

	return true;
}